

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::AreaLightSource
          (ParsedScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  long lVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string *in_RSI;
  long in_RDI;
  ParameterDictionary *in_stack_fffffffffffffee8;
  ParameterDictionary *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_01;
  polymorphic_allocator<pbrt::ParsedParameter_*> in_stack_ffffffffffffff20;
  ParsedParameter **in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  
  this_01 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             *)&stack0x00000008;
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[16]>
              ((FileLoc *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (char (*) [16])in_stack_ffffffffffffff20.memoryResource);
  }
  else if (*(int *)(in_RDI + 0x860) == 0) {
    Error<char_const(&)[16]>
              ((FileLoc *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (char (*) [16])in_stack_ffffffffffffff20.memoryResource);
  }
  else {
    std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0xac0) + 0x68),in_RSI);
    this_00 = (ParameterDictionary *)&stack0xffffffffffffff20;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(this_01,in_RDX);
    ParameterDictionary::ParameterDictionary
              ((ParameterDictionary *)in_stack_ffffffffffffff50,
               (ParsedParameterVector *)in_stack_ffffffffffffff48,
               (ParsedParameterVector *)in_stack_ffffffffffffff40,
               (RGBColorSpace *)in_stack_ffffffffffffff38);
    ParameterDictionary::operator=(this_00,in_stack_fffffffffffffee8);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x440d04);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&this_00->params);
    lVar1 = *(long *)(in_RDI + 0xac0);
    *(memory_resource **)(lVar1 + 0xf0) = (this_01->alloc).memoryResource;
    *(ParsedParameter ***)(lVar1 + 0xf8) = this_01->ptr;
    *(ParsedParameter **)(lVar1 + 0x100) = (this_01->field_2).fixed[0];
  }
  return;
}

Assistant:

void ParsedScene::AreaLightSource(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    VERIFY_WORLD("AreaLightSource");
    graphicsState->areaLightName = name;
    graphicsState->areaLightParams = ParameterDictionary(
        std::move(params), graphicsState->lightAttributes, graphicsState->colorSpace);
    graphicsState->areaLightLoc = loc;
}